

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

USTATUS __thiscall FfsParser::addInfoRecursive(FfsParser *this,UModelIndex *index)

{
  UINT64 UVar1;
  int iVar2;
  UModelIndex *pUVar3;
  bool bVar4;
  UINT32 UVar5;
  int32_t iVar6;
  int iVar7;
  TreeModel *pTVar8;
  char *pcVar9;
  byte local_16a;
  byte local_169;
  UModelIndex local_140;
  int local_124;
  undefined1 local_120 [4];
  int i;
  CBString local_108;
  CBString local_f0;
  CBString local_d8;
  CBString local_c0;
  UByteArray local_a8;
  int32_t local_84;
  int iStack_80;
  UINT32 headerSize;
  UINT64 address;
  UModelIndex local_60;
  CBString local_38;
  UModelIndex *local_20;
  UModelIndex *index_local;
  FfsParser *this_local;
  
  local_20 = index;
  index_local = (UModelIndex *)this;
  bVar4 = UModelIndex::isValid(index);
  pUVar3 = local_20;
  if (bVar4) {
    pTVar8 = this->model;
    UVar5 = TreeModel::offset(pTVar8,local_20);
    usprintf(&local_38,"Offset: %Xh\n",(ulong)UVar5);
    TreeModel::addInfo(pTVar8,pUVar3,&local_38,false);
    Bstrlib::CBString::~CBString(&local_38);
    bVar4 = TreeModel::compressed(this->model,local_20);
    local_169 = 1;
    if (bVar4) {
      UModelIndex::parent(&local_60,local_20);
      bVar4 = UModelIndex::isValid(&local_60);
      local_16a = 0;
      if (bVar4) {
        pTVar8 = this->model;
        UModelIndex::parent((UModelIndex *)&address,local_20);
        bVar4 = TreeModel::compressed(pTVar8,(UModelIndex *)&address);
        local_16a = bVar4 ^ 0xff;
      }
      local_169 = local_16a;
    }
    if ((local_169 & 1) != 0) {
      UVar1 = this->addressDiff;
      UVar5 = TreeModel::base(this->model,local_20);
      _iStack_80 = UVar1 + UVar5;
      if (_iStack_80 < 0x100000000) {
        TreeModel::header(&local_a8,this->model,local_20);
        iVar6 = UByteArray::size(&local_a8);
        UByteArray::~UByteArray(&local_a8);
        pUVar3 = local_20;
        local_84 = iVar6;
        if (iVar6 == 0) {
          pTVar8 = this->model;
          usprintf(&local_f0,"Address: %08Xh\n",_iStack_80 & 0xffffffff);
          TreeModel::addInfo(pTVar8,pUVar3,&local_f0,false);
          Bstrlib::CBString::~CBString(&local_f0);
        }
        else {
          pTVar8 = this->model;
          usprintf(&local_c0,"Data address: %08Xh\n",(ulong)(uint)(iStack_80 + iVar6));
          TreeModel::addInfo(pTVar8,pUVar3,&local_c0,false);
          Bstrlib::CBString::~CBString(&local_c0);
          pUVar3 = local_20;
          pTVar8 = this->model;
          usprintf(&local_d8,"Header address: %08Xh\n",_iStack_80 & 0xffffffff);
          TreeModel::addInfo(pTVar8,pUVar3,&local_d8,false);
          Bstrlib::CBString::~CBString(&local_d8);
        }
      }
      pUVar3 = local_20;
      pTVar8 = this->model;
      UVar5 = TreeModel::base(pTVar8,local_20);
      usprintf(&local_108,"Base: %Xh\n",(ulong)UVar5);
      TreeModel::addInfo(pTVar8,pUVar3,&local_108,false);
      Bstrlib::CBString::~CBString(&local_108);
    }
    pUVar3 = local_20;
    pTVar8 = this->model;
    bVar4 = TreeModel::fixed(pTVar8,local_20);
    pcVar9 = "No";
    if (bVar4) {
      pcVar9 = "Yes";
    }
    usprintf((CBString *)local_120,"Fixed: %s\n",pcVar9);
    TreeModel::addInfo(pTVar8,pUVar3,(CBString *)local_120,false);
    Bstrlib::CBString::~CBString((CBString *)local_120);
    for (local_124 = 0; iVar2 = local_124, iVar7 = TreeModel::rowCount(this->model,local_20),
        iVar2 < iVar7; local_124 = local_124 + 1) {
      pTVar8 = UModelIndex::model(local_20);
      TreeModel::index((TreeModel *)&local_140,(char *)pTVar8,local_124);
      addInfoRecursive(this,&local_140);
    }
    this_local = (FfsParser *)0x0;
  }
  else {
    this_local = (FfsParser *)0x1;
  }
  return (USTATUS)this_local;
}

Assistant:

USTATUS FfsParser::addInfoRecursive(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return U_INVALID_PARAMETER;
    
    // Add offset
    model->addInfo(index, usprintf("Offset: %Xh\n", model->offset(index)), false);
    
    // Add current base if the element is not compressed
    // or it's compressed, but its parent isn't
    if ((!model->compressed(index)) || (index.parent().isValid() && !model->compressed(index.parent()))) {
        // Add physical address of the whole item or its header and data portions separately
        UINT64 address = addressDiff + model->base(index);
        if (address <= 0xFFFFFFFFUL) {
            UINT32 headerSize = (UINT32)model->header(index).size();
            if (headerSize) {
                model->addInfo(index, usprintf("Data address: %08Xh\n", (UINT32)address + headerSize),false);
                model->addInfo(index, usprintf("Header address: %08Xh\n", (UINT32)address), false);
            }
            else {
                model->addInfo(index, usprintf("Address: %08Xh\n", (UINT32)address), false);
            }
        }
        // Add base
        model->addInfo(index, usprintf("Base: %Xh\n", model->base(index)), false);
    }
    model->addInfo(index, usprintf("Fixed: %s\n", model->fixed(index) ? "Yes" : "No"), false);
    
    // Process child items
    for (int i = 0; i < model->rowCount(index); i++) {
        addInfoRecursive(index.model()->index(i, 0, index));
    }
    
    return U_SUCCESS;
}